

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int __thiscall asmjit::_abi_1_10::String::truncate(String *this,char *__file,__off_t __length)

{
  bool bVar1;
  
  bVar1 = isLargeOrExternal(this);
  if (bVar1) {
    if (__file < (char *)(this->field_0)._large.size) {
      __file[*(long *)((long)&this->field_0 + 0x18)] = '\0';
      (this->field_0)._large.size = (size_t)__file;
    }
  }
  else if (__file < (char *)(ulong)(this->field_0)._type) {
    (this->field_0)._small.data[(long)__file] = '\0';
    (this->field_0)._type = (uint8_t)__file;
  }
  return 0;
}

Assistant:

Error String::truncate(size_t newSize) noexcept {
  if (isLargeOrExternal()) {
    if (newSize < _large.size) {
      _large.data[newSize] = '\0';
      _large.size = newSize;
    }
  }
  else {
    if (newSize < _type) {
      _small.data[newSize] = '\0';
      _small.type = uint8_t(newSize);
    }
  }

  return kErrorOk;
}